

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32_update_fg_30_var
               (int len,secp256k1_modinv32_signed30 *f,secp256k1_modinv32_signed30 *g,
               secp256k1_modinv32_trans2x2 *t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = t->u;
  iVar2 = t->v;
  iVar3 = t->q;
  iVar4 = t->r;
  lVar8 = (long)g->v[0] * (long)iVar2 + (long)f->v[0] * (long)iVar1;
  lVar6 = (long)g->v[0] * (long)iVar4 + (long)f->v[0] * (long)iVar3;
  lVar5 = (long)len;
  lVar7 = 1;
  while( true ) {
    if (lVar5 <= lVar7) break;
    lVar8 = (long)f->v[lVar7] * (long)iVar1 + (lVar8 >> 0x1e) + (long)g->v[lVar7] * (long)iVar2;
    lVar6 = (long)f->v[lVar7] * (long)iVar3 + (lVar6 >> 0x1e) + (long)g->v[lVar7] * (long)iVar4;
    f->v[lVar7 + -1] = (uint)lVar8 & 0x3fffffff;
    g->v[lVar7 + -1] = (uint)lVar6 & 0x3fffffff;
    lVar7 = lVar7 + 1;
  }
  f->v[lVar5 + -1] = (int32_t)(lVar8 >> 0x1e);
  g->v[lVar5 + -1] = (int32_t)(lVar6 >> 0x1e);
  return;
}

Assistant:

static void secp256k1_modinv32_update_fg_30_var(int len, secp256k1_modinv32_signed30 *f, secp256k1_modinv32_signed30 *g, const secp256k1_modinv32_trans2x2 *t) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t fi, gi;
    int64_t cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    cf = (int64_t)u * fi + (int64_t)v * gi;
    cg = (int64_t)q * fi + (int64_t)r * gi;
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cf & M30) == 0); cf >>= 30;
    VERIFY_CHECK(((int32_t)cg & M30) == 0); cg >>= 30;
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 30 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        cf += (int64_t)u * fi + (int64_t)v * gi;
        cg += (int64_t)q * fi + (int64_t)r * gi;
        f->v[i - 1] = (int32_t)cf & M30; cf >>= 30;
        g->v[i - 1] = (int32_t)cg & M30; cg >>= 30;
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = (int32_t)cf;
    g->v[len - 1] = (int32_t)cg;
}